

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.c
# Opt level: O0

uint objgetp_end(mcmcxdef *ctx,objnum objn,prpnum prop)

{
  uint uVar1;
  int iVar2;
  uchar *puVar3;
  uint valsiz;
  uint ofs;
  prpdef *propptr;
  objdef *objp;
  dattyp *in_stack_00000040;
  prpnum in_stack_0000004c;
  objnum in_stack_0000004e;
  mcmcxdef *in_stack_00000050;
  undefined2 uVar4;
  mcmon objnum;
  mcmcxdef *in_stack_ffffffffffffffd8;
  uint local_4;
  
  uVar1 = objgetp(in_stack_00000050,in_stack_0000004e,in_stack_0000004c,in_stack_00000040);
  uVar4 = (undefined2)uVar1;
  objnum = (mcmon)(uVar1 >> 0x10);
  if (uVar1 == 0) {
    local_4 = 0;
  }
  else {
    puVar3 = mcmlck(in_stack_ffffffffffffffd8,objnum);
    if (CONCAT22(objnum,uVar4) == 0) {
      puVar3 = (uchar *)0x0;
    }
    else {
      puVar3 = puVar3 + CONCAT22(objnum,uVar4);
    }
    iVar2 = osrp2(puVar3 + 3);
    mcmunlck((mcmcxdef *)CONCAT26(objnum,CONCAT24(uVar4,iVar2)),(mcmon)((ulong)puVar3 >> 0x30));
    local_4 = CONCAT22(objnum,uVar4) + 6 + iVar2;
  }
  return local_4;
}

Assistant:

uint objgetp_end(mcmcxdef *ctx, objnum objn, prpnum prop)
{
    objdef *objp;
    prpdef *propptr;
    uint    ofs;
    uint    valsiz;
    
    /* get the start of the object */
    ofs = objgetp(ctx, objn, prop, 0);
    if (ofs == 0)
        return 0;

    /* get the object */
    objp = mcmlck(ctx, (mcmon)objn);

    /* get the property */
    propptr = objofsp(objp, ofs);

    /* get the data size */
    valsiz = prpsize(propptr);

    /* done with the object */
    mcmunlck(ctx, (mcmon)objn);

    /* 
     *   return the ending offset - it's the starting offset plus the
     *   property header size plus the size of the property data 
     */
    return ofs + PRPHDRSIZ + valsiz;
}